

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BFTraceReader.cpp
# Opt level: O1

void __thiscall BFTraceReader::loadCFGs(BFTraceReader *this)

{
  bool bVar1;
  pointer pcVar2;
  Addr AVar3;
  long ******pppppplVar4;
  long *******ppppppplVar5;
  int iVar6;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *this_00;
  anon_union_8_3_0f55d3ce_for_data *__s;
  CFG *this_01;
  long *plVar7;
  _List_node_base *p_Var8;
  mapped_type *pmVar9;
  CfgNode *this_02;
  BlockData *pBVar10;
  CfgNode *pCVar11;
  mapped_type *pmVar12;
  string *psVar13;
  _List_node_base *p_Var14;
  _Rb_tree_node_base *p_Var15;
  TerminatorType TVar16;
  long *******ppppppplVar17;
  size_type *psVar18;
  string *psVar19;
  string *psVar20;
  string keyword;
  Addr src;
  Addr dst;
  list<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_> symbols;
  undefined1 local_d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _List_node_base local_a0;
  string *local_90;
  anon_union_8_3_0f55d3ce_for_data local_88;
  long ******local_80;
  long ******local_78;
  long local_70;
  _List_node_base *local_68;
  long ******local_60;
  _Rb_tree_node_base *local_58;
  _Rb_tree_node_base *local_50;
  map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  *local_48;
  map<unsigned_long,_BFTraceReader::BasicBlock,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
  *local_40;
  string *local_38;
  
  local_80 = (long ******)&local_80;
  local_70 = 0;
  local_78 = local_80;
  if ((this->m_current).type == TKN_KEYWORD) {
    local_90 = &(this->m_current).token;
    __s = (anon_union_8_3_0f55d3ce_for_data *)0x0;
    do {
      local_d0._0_8_ = local_d0 + 0x10;
      pcVar2 = (this->m_current).token._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_d0,pcVar2,pcVar2 + (this->m_current).token._M_string_length);
      matchToken(this,TKN_KEYWORD);
      iVar6 = std::__cxx11::string::compare((char *)local_d0);
      if (iVar6 == 0) {
        __s = (anon_union_8_3_0f55d3ce_for_data *)operator_new(0xe8);
        memset(__s,0,0xe8);
        __s[2].addr = (Addr)(__s + 4);
        __s[3].addr = 0;
        __s[4].boolean = false;
        __s[6].addr = (Addr)(__s + 8);
        __s[7].addr = 0;
        __s[8].boolean = false;
        *(undefined4 *)(__s + 0xc) = 0;
        __s[0xd].addr = 0;
        __s[0xe].addr = (Addr)(__s + 0xc);
        __s[0xf].addr = (Addr)(__s + 0xc);
        __s[0x10].addr = 0;
        *(undefined4 *)(__s + 0x12) = 0;
        __s[0x13].addr = 0;
        __s[0x14].addr = (Addr)(__s + 0x12);
        __s[0x15].addr = (Addr)(__s + 0x12);
        __s[0x16].addr = 0;
        *(undefined4 *)(__s + 0x18) = 0;
        __s[0x19].addr = 0;
        __s[0x1a].addr = (Addr)(__s + 0x18);
        __s[0x1b].addr = (Addr)(__s + 0x18);
        __s[0x1c].addr = 0;
        p_Var8 = (_List_node_base *)operator_new(0x18);
        p_Var8[1]._M_next = (_List_node_base *)__s;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        local_70 = local_70 + 1;
        *__s = (this->m_current).data;
        matchToken(this,TKN_ADDR);
        __s[1] = (this->m_current).data;
        matchToken(this,TKN_ADDR);
        std::__cxx11::string::_M_assign((string *)&__s[2].boolean);
        matchToken(this,TKN_STRING);
        std::__cxx11::string::_M_assign((string *)&__s[6].boolean);
        matchToken(this,TKN_STRING);
        __s[10] = (this->m_current).data;
        matchToken(this,TKN_ADDR);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)local_d0);
        if (iVar6 == 0) {
          matchToken(this,TKN_ADDR);
          matchToken(this,TKN_ADDR);
          __s = (anon_union_8_3_0f55d3ce_for_data *)0x0;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)local_d0);
          if (iVar6 == 0) {
            if (__s == (anon_union_8_3_0f55d3ce_for_data *)0x0) {
              __assert_fail("sym != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                            ,0x44,"virtual void BFTraceReader::loadCFGs()");
            }
            AVar3 = (this->m_current).data.addr;
            matchToken(this,TKN_ADDR);
            if (AVar3 != __s->addr) {
              __assert_fail("faddr == sym->start",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                            ,0x48,"virtual void BFTraceReader::loadCFGs()");
            }
            local_88 = (anon_union_8_3_0f55d3ce_for_data)(this->m_current).data.addr;
            matchToken(this,TKN_ADDR);
            pmVar9 = std::
                     map<unsigned_long,_BFTraceReader::BasicBlock,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
                     ::operator[]((map<unsigned_long,_BFTraceReader::BasicBlock,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
                                   *)(__s + 0xb),&local_88.addr);
            AVar3 = (this->m_current).data.addr;
            matchToken(this,TKN_ADDR);
            pmVar9->size = (int)AVar3 - local_88._0_4_;
            matchToken(this,TKN_ADDR);
            local_b0._M_allocated_capacity = (size_type)&local_a0;
            pcVar2 = (this->m_current).token._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,pcVar2,pcVar2 + (this->m_current).token._M_string_length)
            ;
            matchToken(this,TKN_KEYWORD);
            iVar6 = std::__cxx11::string::compare(local_b0._M_local_buf);
            if (iVar6 == 0) {
              TVar16 = JUMP;
            }
            else {
              iVar6 = std::__cxx11::string::compare(local_b0._M_local_buf);
              if (iVar6 == 0) {
                TVar16 = CALL;
              }
              else {
                iVar6 = std::__cxx11::string::compare(local_b0._M_local_buf);
                if (iVar6 == 0) {
                  TVar16 = RETURN;
                }
                else {
                  iVar6 = std::__cxx11::string::compare(local_b0._M_local_buf);
                  TVar16 = OTHER;
                  if (iVar6 != 0) {
                    __assert_fail("term_type == \"other\"",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                                  ,0x5d,"virtual void BFTraceReader::loadCFGs()");
                  }
                }
              }
            }
            pmVar9->type = TVar16;
            bVar1 = (this->m_current).data.boolean;
            matchToken(this,TKN_BOOL);
            if (bVar1 != false) {
              std::
              _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              ::_M_insert_unique<unsigned_long_const&>
                        ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                          *)&__s[0x17].boolean,&local_88.addr);
            }
            bVar1 = (this->m_current).data.boolean;
            matchToken(this,TKN_BOOL);
            pmVar9->is_exit = bVar1;
            if ((_List_node_base *)local_b0._M_allocated_capacity != &local_a0) {
              operator_delete((void *)local_b0._M_allocated_capacity);
            }
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)local_d0);
            if ((iVar6 == 0) ||
               (iVar6 = std::__cxx11::string::compare((char *)local_d0), iVar6 == 0)) {
              matchToken(this,TKN_ADDR);
              matchToken(this,TKN_ADDR);
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)local_d0);
              if (iVar6 != 0) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                              ,0x7a,"virtual void BFTraceReader::loadCFGs()");
              }
              if (__s == (anon_union_8_3_0f55d3ce_for_data *)0x0) {
                __assert_fail("sym != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                              ,0x70,"virtual void BFTraceReader::loadCFGs()");
              }
              local_b0._M_allocated_capacity = (size_type)(this->m_current).data;
              matchToken(this,TKN_ADDR);
              local_88 = (this->m_current).data;
              matchToken(this,TKN_ADDR);
              this_00 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                         *)std::
                           map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                           ::operator[]((map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                                         *)(__s + 0x11),&local_b0._M_allocated_capacity);
              std::
              _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              ::_M_insert_unique<unsigned_long_const&>(this_00,&local_88.addr);
            }
          }
        }
      }
      if ((string *)local_d0._0_8_ != (string *)(local_d0 + 0x10)) {
        operator_delete((void *)local_d0._0_8_);
      }
    } while ((this->m_current).type == TKN_KEYWORD);
  }
  matchToken(this,TKN_EOF);
  if ((long *******)local_80 != &local_80) {
    ppppppplVar17 = (long *******)local_80;
    do {
      pppppplVar4 = ppppppplVar17[2];
      p_Var15 = (_Rb_tree_node_base *)pppppplVar4[0x1a];
      local_58 = (_Rb_tree_node_base *)(pppppplVar4 + 0x18);
      local_60 = (long ******)ppppppplVar17;
      if (p_Var15 != local_58) {
        local_40 = (map<unsigned_long,_BFTraceReader::BasicBlock,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
                    *)(pppppplVar4 + 0xb);
        local_90 = (string *)(pppppplVar4 + 0xc);
        local_48 = (map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                    *)(pppppplVar4 + 0x11);
        do {
          local_68 = *(_List_node_base **)(p_Var15 + 1);
          local_50 = p_Var15;
          this_01 = CFGReader::instance(&this->super_CFGReader,(Addr)local_68);
          local_b0._M_allocated_capacity = (size_type)&local_a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pppppplVar4[2],(long)pppppplVar4[3] + (long)pppppplVar4[2])
          ;
          std::__cxx11::string::append(local_b0._M_local_buf);
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     (local_b0._M_local_buf,(ulong)pppppplVar4[6]);
          psVar18 = (size_type *)(plVar7 + 2);
          if ((size_type *)*plVar7 == psVar18) {
            local_d0._16_8_ = *psVar18;
            local_d0._24_8_ = plVar7[3];
            local_d0._0_8_ = local_d0 + 0x10;
          }
          else {
            local_d0._16_8_ = *psVar18;
            local_d0._0_8_ = (size_type *)*plVar7;
          }
          local_d0._8_8_ = plVar7[1];
          *plVar7 = (long)psVar18;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          CFG::setFunctionName(this_01,(string *)local_d0);
          if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
            operator_delete((void *)local_d0._0_8_);
          }
          if ((_List_node_base *)local_b0._M_allocated_capacity != &local_a0) {
            operator_delete((void *)local_b0._M_allocated_capacity);
          }
          local_d0._16_8_ = 0;
          local_d0._0_8_ = (string *)local_d0;
          local_d0._8_8_ = (string *)local_d0;
          p_Var8 = (_List_node_base *)operator_new(0x18);
          p_Var8[1]._M_next = local_68;
          std::__detail::_List_node_base::_M_hook(p_Var8);
          local_d0._16_8_ = local_d0._16_8_ + 1;
          psVar13 = (string *)local_d0._0_8_;
          while (psVar13 != (string *)local_d0) {
            local_b0._M_allocated_capacity = (psVar13->field_2)._M_allocated_capacity;
            if ((_List_node_base *)local_b0._M_allocated_capacity == (_List_node_base *)0x0) {
              __assert_fail("addr != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                            ,0x8a,"virtual void BFTraceReader::loadCFGs()");
            }
            psVar19 = local_90;
            for (psVar20 = (string *)pppppplVar4[0xd]; psVar20 != (string *)0x0;
                psVar20 = *(string **)
                           ((long)&psVar20->field_2 +
                           (ulong)((_List_node_base *)
                                   ((anon_union_8_3_0f55d3ce_for_data *)(psVar20 + 1))->addr <
                                  local_b0._M_allocated_capacity) * 8)) {
              if ((_List_node_base *)((anon_union_8_3_0f55d3ce_for_data *)(psVar20 + 1))->addr >=
                  local_b0._M_allocated_capacity) {
                psVar19 = psVar20;
              }
            }
            psVar20 = local_90;
            if ((psVar19 != local_90) &&
               (psVar20 = psVar19,
               local_b0._M_allocated_capacity <
               (_List_node_base *)((anon_union_8_3_0f55d3ce_for_data *)(psVar19 + 1))->addr)) {
              psVar20 = local_90;
            }
            if (psVar20 == local_90) {
              __assert_fail("sym->blocks.find(addr) != sym->blocks.end()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                            ,0x8c,"virtual void BFTraceReader::loadCFGs()");
            }
            pmVar9 = std::
                     map<unsigned_long,_BFTraceReader::BasicBlock,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
                     ::operator[](local_40,&local_b0._M_allocated_capacity);
            local_38 = psVar13;
            this_02 = CFG::nodeByAddr(this_01,local_b0._M_allocated_capacity);
            if (this_02 == (CfgNode *)0x0) {
              this_02 = (CfgNode *)operator_new(0x18);
              CfgNode::CfgNode(this_02,CFG_BLOCK);
              pBVar10 = (BlockData *)operator_new(0x90);
              CfgNode::BlockData::BlockData
                        (pBVar10,local_b0._M_allocated_capacity,pmVar9->size,false);
              CfgNode::setData(this_02,(Data *)pBVar10);
              CFG::addNode(this_01,this_02);
            }
            else {
              if (this_02->m_type != CFG_PHANTOM) {
                __assert_fail("node->type() == CfgNode::CFG_PHANTOM",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                              ,0x95,"virtual void BFTraceReader::loadCFGs()");
              }
              pBVar10 = (BlockData *)operator_new(0x90);
              CfgNode::BlockData::BlockData
                        (pBVar10,local_b0._M_allocated_capacity,pmVar9->size,false);
              CfgNode::setData(this_02,(Data *)pBVar10);
            }
            if ((_List_node_base *)local_b0._M_allocated_capacity == local_68) {
              if (this_01->m_entryNode != (CfgNode *)0x0) {
                __assert_fail("cfg->entryNode() == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                              ,0x9a,"virtual void BFTraceReader::loadCFGs()");
              }
              pCVar11 = CFGReader::entryNode(this_01);
              CFG::addEdge(this_01,pCVar11,this_02,0);
            }
            if ((pmVar9->is_exit != false) || (pmVar9->type == RETURN)) {
              pCVar11 = CFGReader::exitNode(this_01);
              CFG::addEdge(this_01,this_02,pCVar11,0);
            }
            pmVar12 = std::
                      map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                      ::operator[](local_48,&local_b0._M_allocated_capacity);
            for (p_Var15 = (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var15 != &(pmVar12->_M_t)._M_impl.super__Rb_tree_header;
                p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
              p_Var8 = *(_List_node_base **)(p_Var15 + 1);
              pCVar11 = CFGReader::nodeWithAddr(this_01,(Addr)p_Var8);
              CFG::addEdge(this_01,this_02,pCVar11,0);
              for (psVar13 = (string *)local_d0._0_8_;
                  (psVar13 != (string *)local_d0 &&
                  ((_List_node_base *)(psVar13->field_2)._M_allocated_capacity != p_Var8));
                  psVar13 = (string *)(psVar13->_M_dataplus)._M_p) {
              }
              if (psVar13 == (string *)local_d0) {
                p_Var14 = (_List_node_base *)operator_new(0x18);
                p_Var14[1]._M_next = p_Var8;
                std::__detail::_List_node_base::_M_hook(p_Var14);
                local_d0._16_8_ = local_d0._16_8_ + 1;
              }
            }
            psVar13 = (string *)(local_38->_M_dataplus)._M_p;
          }
          CFG::check(this_01);
          psVar13 = (string *)local_d0._0_8_;
          while (psVar13 != (string *)local_d0) {
            psVar20 = (string *)(psVar13->_M_dataplus)._M_p;
            operator_delete(psVar13);
            psVar13 = psVar20;
          }
          p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_50);
        } while (p_Var15 != local_58);
      }
      if (pppppplVar4 != (long ******)0x0) {
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)(pppppplVar4 + 0x17));
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                     *)(pppppplVar4 + 0x11));
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>,_std::_Select1st<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>,_std::_Select1st<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
                     *)(pppppplVar4 + 0xb));
        if ((long ******)pppppplVar4[6] != pppppplVar4 + 8) {
          operator_delete(pppppplVar4[6]);
        }
        if ((long ******)pppppplVar4[2] != pppppplVar4 + 4) {
          operator_delete(pppppplVar4[2]);
        }
        operator_delete(pppppplVar4);
      }
      ppppppplVar17 = (long *******)*local_60;
    } while (ppppppplVar17 != &local_80);
  }
  ppppppplVar17 = (long *******)local_80;
  while (ppppppplVar17 != &local_80) {
    ppppppplVar5 = (long *******)*ppppppplVar17;
    operator_delete(ppppppplVar17);
    ppppppplVar17 = ppppppplVar5;
  }
  return;
}

Assistant:

void BFTraceReader::loadCFGs() {
	Symbol* sym = 0;
	std::list<Symbol*> symbols;

	while (m_current.type == InputTokenizer::Lexeme::TKN_KEYWORD) {
		std::string keyword = m_current.token;
		matchToken(InputTokenizer::Lexeme::TKN_KEYWORD);

		if (keyword == "symbol") {
			sym = new Symbol();
			symbols.push_back(sym);

			sym->start = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			sym->end = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			sym->filename = m_current.token;
			matchToken(InputTokenizer::Lexeme::TKN_STRING);

			sym->functname = m_current.token;
			matchToken(InputTokenizer::Lexeme::TKN_STRING);

			sym->bias = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
		} else if (keyword == "program-entry") {
			sym = 0;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
		} else if (keyword == "block") {
			assert(sym != 0);

			Addr faddr = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			assert(faddr == sym->start);

			Addr bb_addr = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			BasicBlock& bb = sym->blocks[bb_addr];

			Addr bb_end = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			bb.size = bb_end - bb_addr;

			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			std::string term_type = m_current.token;
			matchToken(InputTokenizer::Lexeme::TKN_KEYWORD);
			if (term_type == "jump")
				bb.type = BFTraceReader::JUMP;
			else if (term_type == "call")
				bb.type = BFTraceReader::CALL;
			else if (term_type == "return")
				bb.type = BFTraceReader::RETURN;
			else {
				assert(term_type == "other");
				bb.type = BFTraceReader::OTHER;
			}

			bool is_entry = m_current.data.boolean;
			matchToken(InputTokenizer::Lexeme::TKN_BOOL);
			if (is_entry)
				sym->entries.insert(bb_addr);

			bool is_exit = m_current.data.boolean;
			matchToken(InputTokenizer::Lexeme::TKN_BOOL);
			bb.is_exit = is_exit;
		} else if (keyword == "call") {
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
		} else if (keyword == "return") {
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
		} else if (keyword == "br") {
			assert(sym != 0);

			Addr src = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			Addr dst = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			sym->edges[src].insert(dst);
		} else {
			assert(false);
		}
	}

	matchToken(InputTokenizer::Lexeme::TKN_EOF);

	for (Symbol* sym : symbols) {
		for (Addr entry : sym->entries) {
			CFG* cfg = this->instance(entry);
			cfg->setFunctionName(sym->filename + "::" + sym->functname);

			std::list<Addr> nodes;
			nodes.push_back(entry);
			for (std::list<Addr>::iterator it = nodes.begin(), ed = nodes.end();
					it != ed; ++it) {
				Addr addr = *it;
				assert(addr != 0);

				assert(sym->blocks.find(addr) != sym->blocks.end());
				BasicBlock& bb = sym->blocks[addr];

				CfgNode* node = cfg->nodeByAddr(addr);
				if (node == 0) {
					node = new CfgNode(CfgNode::CFG_BLOCK);
					node->setData(new CfgNode::BlockData(addr, bb.size));
					cfg->addNode(node);
				} else {
					assert(node->type() == CfgNode::CFG_PHANTOM);
					node->setData(new CfgNode::BlockData(addr, bb.size));
				}

				if (addr == entry) {
					assert(cfg->entryNode() == 0);
					CfgNode* entry = CFGReader::entryNode(cfg);
					cfg->addEdge(entry, node);
				}

				if (bb.is_exit || bb.type == BFTraceReader::RETURN) {
					CfgNode* exit = CFGReader::exitNode(cfg);
					cfg->addEdge(node, exit);
				}

				for (Addr dst : sym->edges[addr]) {
					cfg->addEdge(node, CFGReader::nodeWithAddr(cfg, dst));

					if (std::find(nodes.begin(), ed, dst) == ed)
						nodes.push_back(dst);
				}
			}

			cfg->check();
		}

		delete sym;
	}
}